

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

int __thiscall ear::PolarPointSourcePanner::_numberOfRequiredChannels(PolarPointSourcePanner *this)

{
  bool bVar1;
  Scalar_conflict SVar2;
  undefined1 local_50 [28];
  Scalar_conflict maxRegion;
  unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *region;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  *__range1;
  int ret;
  PolarPointSourcePanner *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ::begin(&this->_regions);
  region = (unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_> *)
           std::
           vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           ::end(&this->_regions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
                                *)&region);
    if (!bVar1) break;
    register0x00000000 =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
         ::operator*(&__end1);
    std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>::operator->
              (register0x00000000);
    RegionHandler::outputChannels((RegionHandler *)local_50);
    SVar2 = Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::maxCoeff
                      ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_50);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_50);
    if (__range1._4_4_ < SVar2) {
      __range1._4_4_ = SVar2;
    }
    local_50._20_4_ = SVar2;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_*,_std::vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_ + 1;
}

Assistant:

int PolarPointSourcePanner::_numberOfRequiredChannels() {
    int ret = 0;
    for (const auto& region : _regions) {
      auto maxRegion = region->outputChannels().maxCoeff();
      if (ret < maxRegion) {
        ret = maxRegion;
      }
    }
    return ret + 1;
  }